

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

void absl::lts_20250127::base_internal::AddToFreelist(void *v,Arena *arena)

{
  AllocList *pAVar1;
  long *plVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  AllocList *e;
  uint *puVar7;
  AllocList *pAVar8;
  ulong uVar9;
  ulong uVar10;
  AllocList *prev [30];
  ArenaLock AStack_2d0;
  AllocList *apAStack_240 [31];
  AllocList *pAStack_148;
  AllocList *local_118 [31];
  
  pAVar1 = (AllocList *)((long)v + -0x20);
  if ((*(ulong *)((long)v + -0x18) ^ (ulong)pAVar1) == 0x4c833e95) {
    if (*(Arena **)((long)v + -0x10) == arena) {
      iVar5 = LLA_SkiplistLevels(*(size_t *)((long)v + -0x20),arena->min_size,&arena->random);
      *(int *)v = iVar5;
      LLA_SkiplistInsert(&arena->freelist,pAVar1,local_118);
      *(ulong *)((long)v + -0x18) = (ulong)pAVar1 ^ 0xffffffffb37cc16a;
      Coalesce(pAVar1);
      Coalesce(local_118[0]);
      return;
    }
  }
  else {
    AddToFreelist();
  }
  AddToFreelist();
  if (v == (void *)0x0) {
    return;
  }
  pAStack_148 = pAVar1;
  anon_unknown_0::ArenaLock::ArenaLock(&AStack_2d0,arena);
  if (v < (void *)0xffffffffffffffe0) {
    uVar10 = (long)v + arena->round_up + 0x1f;
    if (uVar10 < (long)v + 0x20U) goto LAB_003979ce;
    uVar10 = uVar10 & -arena->round_up;
    pAVar1 = &arena->freelist;
    do {
      iVar5 = LLA_SkiplistLevels(uVar10,arena->min_size,(uint32_t *)0x0);
      if ((arena->freelist).levels < iVar5) {
LAB_003976e8:
        LOCK();
        uVar6 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
        (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i =
             (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i & 2;
        UNLOCK();
        if (7 < uVar6) {
          SpinLock::SlowUnlock(&arena->mu,uVar6);
        }
        uVar9 = arena->pagesize * 0x10 + (uVar10 - 1);
        if (uVar9 < uVar10) {
LAB_0039796a:
          raw_log_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1b5,"Check %s failed: %s","sum >= a",
                     "LowLevelAlloc arithmetic overflow");
          DoAllocWithArena();
          goto LAB_0039799c;
        }
        uVar9 = uVar9 & arena->pagesize * -0x10;
        if ((arena->flags & 2) == 0) {
          e = (AllocList *)mmap((void *)0x0,uVar9,3,0x22,-1,0);
        }
        else {
          e = (AllocList *)syscall(9,0,uVar9,3,0x22,0xffffffffffffffff,0);
        }
        if (e == (AllocList *)0xffffffffffffffff) goto LAB_00397a64;
        uVar6 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
        if ((uVar6 & 1) == 0) {
          LOCK();
          uVar3 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
          if (uVar6 == uVar3) {
            (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i = uVar6 | 1;
            uVar3 = uVar6;
          }
          uVar6 = uVar3;
          UNLOCK();
        }
        if ((uVar6 & 1) != 0) {
          SpinLock::SlowLock(&arena->mu);
        }
        (e->header).size = uVar9;
        (e->header).magic = (ulong)e ^ 0x4c833e95;
        (e->header).arena = arena;
        bVar4 = false;
        AddToFreelist(&e->levels,arena);
      }
      else {
        pAVar8 = pAVar1;
LAB_00397679:
        if (pAVar8->levels < iVar5) {
          raw_log_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1c5,"Check %s failed: %s","i < prev->levels",
                     "too few levels in Next()");
          DoAllocWithArena();
LAB_003978a2:
          raw_log_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1ca,"Check %s failed: %s",
                     "next->header.magic == Magic(kMagicUnallocated, &next->header)",
                     "bad magic number in Next()");
          DoAllocWithArena();
LAB_003978d4:
          raw_log_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1cb,"Check %s failed: %s",
                     "next->header.arena == arena","bad arena pointer in Next()");
          DoAllocWithArena();
LAB_00397906:
          raw_log_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1cd,"Check %s failed: %s","prev < next",
                     "unordered freelist");
          DoAllocWithArena();
LAB_00397938:
          raw_log_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1d0,"Check %s failed: %s",
                     "reinterpret_cast<char *>(prev) + prev->header.size < reinterpret_cast<char *>(next)"
                     ,"malformed freelist");
          DoAllocWithArena();
          goto LAB_0039796a;
        }
        e = pAVar8->next[iVar5 + -1];
        if (e != (AllocList *)0x0) {
          if (((e->header).magic ^ (ulong)e) != 0xffffffffb37cc16a) goto LAB_003978a2;
          if ((e->header).arena != arena) goto LAB_003978d4;
          if (pAVar1 != pAVar8) {
            if (e <= pAVar8) goto LAB_00397906;
            if ((AllocList *)((long)pAVar8->next + ((pAVar8->header).size - 0x28)) < e)
            goto LAB_003976c6;
            goto LAB_00397938;
          }
LAB_003976c6:
          bVar4 = true;
          if ((e == (AllocList *)0x0) || (pAVar8 = e, uVar10 <= (e->header).size))
          goto LAB_003976df;
          goto LAB_00397679;
        }
        bVar4 = false;
LAB_003976df:
        if (e == (AllocList *)0x0) goto LAB_003976e8;
      }
    } while (!bVar4);
    LLA_SkiplistDelete(pAVar1,e,apAStack_240);
    if (!CARRY8(arena->min_size,uVar10)) {
      uVar9 = (e->header).size;
      if (arena->min_size + uVar10 <= uVar9) {
        plVar2 = (long *)((long)e->next + (uVar10 - 0x28));
        *plVar2 = uVar9 - uVar10;
        plVar2[1] = (long)e->next + (uVar10 - 0x28) ^ 0x4c833e95;
        plVar2[2] = (long)arena;
        (e->header).size = uVar10;
        AddToFreelist(plVar2 + 4,arena);
      }
      (e->header).magic = (ulong)e ^ 0x4c833e95;
      if ((e->header).arena == arena) {
        arena->allocation_count = arena->allocation_count + 1;
        anon_unknown_0::ArenaLock::Leave(&AStack_2d0);
        anon_unknown_0::ArenaLock::~ArenaLock(&AStack_2d0);
        return;
      }
      goto LAB_00397a32;
    }
  }
  else {
LAB_0039799c:
    raw_log_internal::RawLog
              (kFatal,"low_level_alloc.cc",0x1b5,"Check %s failed: %s","sum >= a",
               "LowLevelAlloc arithmetic overflow");
    DoAllocWithArena();
LAB_003979ce:
    raw_log_internal::RawLog
              (kFatal,"low_level_alloc.cc",0x1b5,"Check %s failed: %s","sum >= a",
               "LowLevelAlloc arithmetic overflow");
    DoAllocWithArena();
  }
  raw_log_internal::RawLog
            (kFatal,"low_level_alloc.cc",0x1b5,"Check %s failed: %s","sum >= a",
             "LowLevelAlloc arithmetic overflow");
  DoAllocWithArena();
LAB_00397a32:
  raw_log_internal::RawLog
            (kFatal,"low_level_alloc.cc",0x25f,"Check %s failed: %s","s->header.arena == arena","");
  DoAllocWithArena();
LAB_00397a64:
  puVar7 = (uint *)__errno_location();
  raw_log_internal::RawLog(kFatal,"low_level_alloc.cc",0x239,"mmap error: %d",(ulong)*puVar7);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                ,0x239,"void *absl::base_internal::DoAllocWithArena(size_t, LowLevelAlloc::Arena *)"
               );
}

Assistant:

static void AddToFreelist(void *v, LowLevelAlloc::Arena *arena) {
  AllocList *f = reinterpret_cast<AllocList *>(reinterpret_cast<char *>(v) -
                                               sizeof(f->header));
  ABSL_RAW_CHECK(f->header.magic == Magic(kMagicAllocated, &f->header),
                 "bad magic number in AddToFreelist()");
  ABSL_RAW_CHECK(f->header.arena == arena,
                 "bad arena pointer in AddToFreelist()");
  f->levels =
      LLA_SkiplistLevels(f->header.size, arena->min_size, &arena->random);
  AllocList *prev[kMaxLevel];
  LLA_SkiplistInsert(&arena->freelist, f, prev);
  f->header.magic = Magic(kMagicUnallocated, &f->header);
  Coalesce(f);        // maybe coalesce with successor
  Coalesce(prev[0]);  // maybe coalesce with predecessor
}